

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O2

bool tcu::matchWildcards(const_iterator patternStart,const_iterator patternEnd,
                        const_iterator pathStart,const_iterator pathEnd,bool allowPrefix)

{
  bool bVar1;
  
  for (; ((patternStart._M_current != patternEnd._M_current &&
          (pathStart._M_current != pathEnd._M_current)) &&
         (*patternStart._M_current == *pathStart._M_current));
      patternStart._M_current = patternStart._M_current + 1) {
    pathStart._M_current = pathStart._M_current + 1;
  }
  if (patternStart._M_current == patternEnd._M_current) {
    bVar1 = pathStart._M_current == pathEnd._M_current;
  }
  else if (*patternStart._M_current == '*') {
    do {
      if (pathStart._M_current == pathEnd._M_current) {
        bVar1 = matchWildcards((const_iterator)(patternStart._M_current + 1),patternEnd,pathEnd,
                               pathEnd,allowPrefix);
        if (bVar1) {
          return true;
        }
        goto LAB_008ce875;
      }
      bVar1 = matchWildcards((const_iterator)(patternStart._M_current + 1),patternEnd,pathStart,
                             pathEnd,allowPrefix);
      pathStart._M_current = pathStart._M_current + 1;
    } while (!bVar1);
    bVar1 = true;
  }
  else {
    bVar1 = true;
    if (pathStart._M_current != pathEnd._M_current || !allowPrefix) {
LAB_008ce875:
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

static bool matchWildcards(string::const_iterator	patternStart,
						   string::const_iterator	patternEnd,
						   string::const_iterator	pathStart,
						   string::const_iterator	pathEnd,
						   bool						allowPrefix)
{
	string::const_iterator	pattern	= patternStart;
	string::const_iterator	path	= pathStart;

	while (pattern != patternEnd && path != pathEnd && *pattern == *path)
	{
		++pattern;
		++path;
	}

	if (pattern == patternEnd)
		return (path == pathEnd);
	else if (*pattern == '*')
	{
		for (; path != pathEnd; ++path)
		{
			if (matchWildcards(pattern + 1, patternEnd, path, pathEnd, allowPrefix))
				return true;
		}

		if (matchWildcards(pattern + 1, patternEnd, pathEnd, pathEnd, allowPrefix))
			return true;
	}
	else if (path == pathEnd && allowPrefix)
		return true;

	return false;
}